

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

uint32_t __thiscall doublechecked::Roaring::maximum(Roaring *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  
  uVar1 = roaring_bitmap_maximum((roaring_bitmap_t *)this);
  if ((this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = std::_Rb_tree_decrement(&(this->check)._M_t._M_impl.super__Rb_tree_header._M_header);
    uVar2 = *(uint32_t *)(lVar3 + 0x20);
  }
  _assert_true((ulong)(uVar1 == uVar2),"check.empty() ? ans == 0 : ans == *check.rbegin()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring_checked.hh"
               ,0xa1);
  return uVar1;
}

Assistant:

uint32_t maximum() const {
        uint32_t ans = plain.maximum();
        assert_true(check.empty() ? ans == 0 : ans == *check.rbegin());
        return ans;
    }